

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnDisarm
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view object,
          PlayerInfo *victim)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  string msg;
  code *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  PlayerInfo *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48 = victim;
  local_40._M_len = object._M_len;
  local_40._M_str = object._M_str;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with(&local_40,"Beacon");
  uVar4 = (uint)*(undefined8 *)&this->field_0xa0;
  if (bVar3) {
    if ((uVar4 >> 0x15 & 1) == 0) {
      local_70 = RenX::Server::sendAdmChan;
    }
    else {
      local_70 = RenX::Server::sendLogChan;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_68,&this->disarmFmt);
  }
  else {
    if ((uVar4 >> 0x16 & 1) == 0) {
      local_70 = RenX::Server::sendAdmChan;
    }
    else {
      local_70 = RenX::Server::sendLogChan;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_68,&this->mineDisarmFmt);
  }
  if (local_68._M_string_length != 0) {
    RenX::processTags((string *)&local_68,server,player,local_48,(BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
    auVar5 = RenX::translateName(object._M_len,object._M_str);
    RenX::replace_tag(&local_68,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    (*local_70)(server,local_68._M_string_length,local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDisarm(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view object, const RenX::PlayerInfo &victim) {
	logFuncType func;
	std::string msg;

	if (std::string_view{object}.ends_with("Beacon")) {
		if (RenX_LoggingPlugin::disarmPublic)
			func = &RenX::Server::sendLogChan;
		else
			func = &RenX::Server::sendAdmChan;

		msg = this->disarmFmt;
	}
	else {
		if (RenX_LoggingPlugin::mineDisarmPublic)
			func = &RenX::Server::sendLogChan;
		else
			func = &RenX::Server::sendAdmChan;

		msg = this->mineDisarmFmt;
	}
	if (!msg.empty()) {
		RenX::processTags(msg, &server, &player, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(object));
		(server.*func)(msg);
	}
}